

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

long __thiscall duckdb::Cast::Operation<duckdb::hugeint_t,long>(Cast *this,hugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  PhysicalType type;
  PhysicalType type_00;
  hugeint_t input_00;
  hugeint_t input_01;
  long result;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  input_00.upper = input.lower;
  iVar2 = 0;
  input_00.lower = (uint64_t)this;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,long>(input_00,&result,false);
  if (bVar1) {
    return result;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  TypeIdToString_abi_cxx11_(&local_e0,(duckdb *)0xcc,type);
  ::std::operator+(&local_c0,"Type ",&local_e0);
  ::std::operator+(&local_a0,&local_c0," with value ");
  input_01.upper = iVar2;
  input_01.lower = input_00.upper;
  ConvertToString::Operation<duckdb::hugeint_t>(&local_100,(ConvertToString *)this,input_01);
  ::std::operator+(&local_80,&local_a0,&local_100);
  ::std::operator+(&local_60,&local_80,
                   " can\'t be cast because the value is out of range for the destination type ");
  TypeIdToString_abi_cxx11_(&local_120,(duckdb *)0x9,type_00);
  ::std::operator+(&local_40,&local_60,&local_120);
  ::std::__cxx11::string::~string((string *)&local_120);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}